

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O1

bool log_is_valid_callstack(int callstack_depth,void **callstack,bool is_alloc)

{
  int iVar1;
  _Rb_tree_header *p_Var2;
  char *__path;
  char *pcVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  undefined7 in_register_00000011;
  bool bVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  string objfile;
  void *addr;
  Dl_info dlinfo;
  allocator local_9d;
  undefined4 local_9c;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  void *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  char *local_50 [4];
  
  local_9c = (undefined4)CONCAT71(in_register_00000011,is_alloc);
  uVar8 = (ulong)(callstack_depth - 1);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  do {
    if ((int)uVar8 < 1) break;
    local_78 = callstack[uVar8];
    p_Var2 = &(objfile_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header;
    p_Var7 = (objfile_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var2->_M_header;
    for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[*(void **)(p_Var7 + 1) < local_78])
    {
      if (*(void **)(p_Var7 + 1) >= local_78) {
        p_Var5 = p_Var7;
      }
    }
    p_Var7 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var2) &&
       (p_Var7 = p_Var5, local_78 < *(void **)(p_Var5 + 1))) {
      p_Var7 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var7 == p_Var2) {
      iVar1 = dladdr(local_78,local_50);
      if ((local_50[0] != (char *)0x0 && iVar1 != 0) &&
         (__path = strdup(local_50[0]), __path != (char *)0x0)) {
        pcVar3 = __xpg_basename(__path);
        std::__cxx11::string::string((string *)local_70,pcVar3,&local_9d);
        std::__cxx11::string::operator=((string *)&local_98,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        pmVar4 = std::
                 map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](objfile_cache_abi_cxx11_,&local_78);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        free(__path);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_98);
    }
    uVar8 = uVar8 - 1;
  } while (local_90 == 0);
  if ((local_90 == 0 || (char)local_9c != '\0') ||
     (iVar1 = std::__cxx11::string::compare((char *)&local_98), iVar1 != 0)) {
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return bVar6;
}

Assistant:

bool log_is_valid_callstack(int callstack_depth, void * const callstack[], bool is_alloc)
{
  int i = callstack_depth - 1;
  std::string objfile;
  while (i > 0)
  {
    void *addr = callstack[i];

    auto it = objfile_cache->find(addr);
    if (it != objfile_cache->end())
    {
      objfile = it->second;
    }
    else
    {
      Dl_info dlinfo;
      if (dladdr(addr, &dlinfo) && dlinfo.dli_fname)
      {
        char *fname = strdup(dlinfo.dli_fname);
        if (fname)
        {
          objfile = std::string(basename(fname));
          (*objfile_cache)[addr] = objfile;
          free(fname);
        }
      }
    }

    if (!objfile.empty())
    {
      // For now only care about originating object file
      break;
    }
      
    --i;
  }

  if (!objfile.empty())
  {
      // ignore invalid dealloc from libobjc
      if (!is_alloc && (objfile == "libobjc.A.dylib")) return false;
  }

  return true;
}